

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest9::verifyXFBData(FunctionalTest9 *this,GLvoid *data_ptr)

{
  ostringstream *this_00;
  bool bVar1;
  uint n_component;
  long lVar2;
  MessageBuilder *pMVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float local_1c8 [6];
  undefined1 local_1b0 [384];
  
  bVar1 = true;
  uVar4 = 0;
  this_00 = (ostringstream *)(local_1b0 + 8);
  do {
    if ((this->m_n_points_to_draw <= uVar4) || (!bVar1)) {
      return;
    }
    local_1c8[0] = 0.0;
    local_1c8[1] = 1.0;
    local_1c8[2] = 2.0;
    local_1c8[3] = 3.0;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      local_1c8[lVar2] = local_1c8[lVar2] + (float)uVar4 + 0.123;
    }
    local_1c8[3] = local_1c8[0] + local_1c8[1] + local_1c8[2] + local_1c8[3];
    fVar6 = local_1c8[0] - *data_ptr;
    fVar5 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar5 = fVar6;
    }
    if (1e-05 < fVar5) {
LAB_00a180de:
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"XFBed data is invalid. Expected:(");
      std::ostream::operator<<(this_00,local_1c8[0]);
      std::operator<<((ostream *)this_00,", ");
      pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1c8 + 1);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8 + 2);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8 + 3);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "), found:(");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)data_ptr);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)((long)data_ptr + 4));
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)((long)data_ptr + 8));
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)((long)data_ptr + 0xc));
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this->m_has_test_passed = false;
      bVar1 = false;
    }
    else {
      fVar6 = local_1c8[1] - *(float *)((long)data_ptr + 4);
      fVar5 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar5 = fVar6;
      }
      if (1e-05 < fVar5) goto LAB_00a180de;
      fVar6 = local_1c8[2] - *(float *)((long)data_ptr + 8);
      fVar5 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar5 = fVar6;
      }
      if (1e-05 < fVar5) goto LAB_00a180de;
      fVar6 = local_1c8[3] - *(float *)((long)data_ptr + 0xc);
      fVar5 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar5 = fVar6;
      }
      bVar1 = true;
      if (1e-05 < fVar5) goto LAB_00a180de;
    }
    data_ptr = (GLvoid *)((long)data_ptr + 0x10);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void FunctionalTest9::verifyXFBData(const glw::GLvoid* data_ptr)
{
	const float			epsilon			= 1e-5f;
	bool				should_continue = true;
	const glw::GLfloat* traveller_ptr   = (const glw::GLfloat*)data_ptr;

	for (unsigned int n_point = 0; n_point < m_n_points_to_draw && should_continue; ++n_point)
	{
		tcu::Vec4 expected_result(0, 1, 2, 3);

		for (unsigned int n_component = 0; n_component < 3 /* xyz */; ++n_component)
		{
			expected_result[n_component] += 0.123f + float(n_point);
		}

		expected_result[3 /* w */] += expected_result[0] + expected_result[1] + expected_result[2];

		if (de::abs(expected_result[0] - traveller_ptr[0]) > epsilon ||
			de::abs(expected_result[1] - traveller_ptr[1]) > epsilon ||
			de::abs(expected_result[2] - traveller_ptr[2]) > epsilon ||
			de::abs(expected_result[3] - traveller_ptr[3]) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data is invalid. Expected:"
														   "("
							   << expected_result[0] << ", " << expected_result[1] << ", " << expected_result[2] << ", "
							   << expected_result[3] << "), found:(" << traveller_ptr[0] << ", " << traveller_ptr[1]
							   << ", " << traveller_ptr[2] << ", " << traveller_ptr[3] << ")."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
			should_continue   = false;
		}

		traveller_ptr += 4; /* xyzw */
	}						/* for (all rendered points) */
}